

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O0

int coda_cursor_read_complex_double_split_array
              (coda_cursor *cursor,double *dst_re,double *dst_im,coda_array_ordering array_ordering)

{
  char *pcVar1;
  coda_type *local_40;
  coda_type *type;
  coda_array_ordering array_ordering_local;
  double *dst_im_local;
  double *dst_re_local;
  coda_cursor *cursor_local;
  
  if (((cursor == (coda_cursor *)0x0) || (cursor->n < 1)) ||
     (cursor->stack[cursor->n + -1].type == (coda_dynamic_type_struct *)0x0)) {
    coda_set_error(-100,"invalid cursor argument (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                   ,0x1651);
    cursor_local._4_4_ = -1;
  }
  else if (dst_re == (double *)0x0) {
    coda_set_error(-100,"dst_re argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                   ,0x1656);
    cursor_local._4_4_ = -1;
  }
  else if (dst_im == (double *)0x0) {
    coda_set_error(-100,"dst_im argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                   ,0x165b);
    cursor_local._4_4_ = -1;
  }
  else {
    if ((cursor->stack[cursor->n + -1].type)->backend < coda_backend_memory) {
      local_40 = (coda_type *)cursor->stack[cursor->n + -1].type;
    }
    else {
      local_40 = (cursor->stack[cursor->n + -1].type)->definition;
    }
    if (local_40->type_class == 1) {
      cursor_local._4_4_ =
           read_split_array(cursor,read_double_pair,(uint8_t *)dst_re,(uint8_t *)dst_im,8,
                            array_ordering);
    }
    else {
      pcVar1 = coda_type_get_class_name(local_40->type_class);
      coda_set_error(-0x69,"cursor does not refer to an array (current type is %s)",pcVar1);
      cursor_local._4_4_ = -1;
    }
  }
  return cursor_local._4_4_;
}

Assistant:

LIBCODA_API int coda_cursor_read_complex_double_split_array(const coda_cursor *cursor, double *dst_re, double *dst_im,
                                                            coda_array_ordering array_ordering)
{
    coda_type *type;

    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (dst_re == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "dst_re argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (dst_im == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "dst_im argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    if (type->type_class != coda_array_class)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "cursor does not refer to an array (current type is %s)",
                       coda_type_get_class_name(type->type_class));
        return -1;
    }
    return read_split_array(cursor, (read_function)&read_double_pair, (uint8_t *)dst_re, (uint8_t *)dst_im,
                            sizeof(double), array_ordering);
}